

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

uchar __thiscall smf::MidiFile::readByte(MidiFile *this,istream *input)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  uchar buffer [1];
  
  uStack_18 = in_RAX & 0xffffffffffffff;
  std::istream::read((char *)input,(long)buffer);
  if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0) {
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error: unexpected end of file.");
    std::endl<char,std::char_traits<char>>(poVar1);
    this->m_rwstatus = false;
    buffer[0] = '\0';
  }
  return buffer[0];
}

Assistant:

uchar MidiFile::readByte(std::istream& input) {
	uchar buffer[1] = {0};
	input.read((char*)buffer, 1);
	if (input.eof()) {
		std::cerr << "Error: unexpected end of file." << std::endl;
		m_rwstatus = false;
		return 0;
	}
	return buffer[0];
}